

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O0

errr init_sound(char *soundstr,wchar_t argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  errr eVar5;
  int local_2c;
  _Bool done;
  wchar_t i;
  char **argv_local;
  wchar_t argc_local;
  char *soundstr_local;
  
  local_2c = 0;
  bVar2 = false;
  close_sound();
  while( true ) {
    bVar1 = false;
    if (sound_modules[local_2c].init != (_func_errr_sound_hooks_ptr_int_char_ptr_ptr *)0x0) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) break;
    if (((soundstr == (char *)0x0) ||
        (iVar4 = strcmp(soundstr,sound_modules[local_2c].name), iVar4 == 0)) &&
       (eVar5 = (*sound_modules[local_2c].init)(&hooks,argc,argv), eVar5 == 0)) {
      bVar2 = true;
    }
    local_2c = local_2c + 1;
  }
  if (bVar2) {
    if (hooks.open_audio_hook == (_func__Bool *)0x0) {
      soundstr_local._4_4_ = 1;
    }
    else {
      _Var3 = (*hooks.open_audio_hook)();
      if (_Var3) {
        event_add_handler(EVENT_SOUND,play_sound,(void *)0x0);
        soundstr_local._4_4_ = 0;
      }
      else {
        soundstr_local._4_4_ = 1;
      }
    }
  }
  else {
    soundstr_local._4_4_ = 1;
  }
  return soundstr_local._4_4_;
}

Assistant:

errr init_sound(const char *soundstr, int argc, char **argv)
{
	int i = 0;
	bool done = false;

	/* Release resources previously allocated if called multiple times. */
	close_sound();

	/* Try the modules in the order specified by sound_modules[] */
	while (sound_modules[i].init && !done) {
		if (!soundstr || streq(soundstr, sound_modules[i].name))
			if (0 == sound_modules[i].init(&hooks, argc, argv))
				done = true;
		i++;
	}

	/* Check that we have a sound module to use */
	if (!done)
		return 1;

	/* Open the platform specific sound system */
	if (!hooks.open_audio_hook)
		return 1;
	if (!hooks.open_audio_hook())
		return 1;

	/* Enable sound */
	event_add_handler(EVENT_SOUND, play_sound, NULL);

	/* Success */
	return (0);
}